

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QDockAreaLayoutInfo * __thiscall
QDockAreaLayoutInfo::info(QDockAreaLayoutInfo *this,QList<int> *path)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  qsizetype qVar5;
  reference pQVar6;
  QDockAreaLayoutInfo *in_RSI;
  QDockAreaLayoutInfo *in_RDI;
  long in_FS_OFFSET;
  int index;
  qsizetype in_stack_ffffffffffffff98;
  QList<QDockAreaLayoutItem> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc0;
  QDockAreaLayoutInfo *this_00;
  QDockAreaLayoutInfo *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  piVar3 = QList<int>::first((QList<int> *)in_stack_ffffffffffffffa0);
  iVar2 = *piVar3;
  if (iVar2 < 0) {
    iVar2 = -1 - iVar2;
  }
  lVar4 = (long)iVar2;
  qVar5 = QList<QDockAreaLayoutItem>::size(&in_RDI->item_list);
  local_28 = in_RDI;
  if (((lVar4 < qVar5) && (qVar5 = QList<int>::size((QList<int> *)in_RSI), qVar5 != 1)) &&
     (pQVar6 = QList<QDockAreaLayoutItem>::operator[]
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98),
     pQVar6->subinfo != (QDockAreaLayoutInfo *)0x0)) {
    QList<QDockAreaLayoutItem>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QList<int>::mid((QList<int> *)this_00,(qsizetype)in_RSI,
                    CONCAT44(iVar2,in_stack_ffffffffffffffc0));
    local_28 = info(in_RSI,(QList<int> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
    QList<int>::~QList((QList<int> *)0x571ebd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

QDockAreaLayoutInfo *QDockAreaLayoutInfo::info(const QList<int> &path)
{
    int index = path.first();
    if (index < 0)
        index = -index - 1;
    if (index >= item_list.size())
        return this;
    if (path.size() == 1 || item_list[index].subinfo == nullptr)
        return this;
    return item_list[index].subinfo->info(path.mid(1));
}